

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O2

void logmsg(char *msg,...)

{
  uint __errnum;
  FILE *whereto;
  char in_AL;
  time_t tVar1;
  tm *ptVar2;
  FILE *__stream;
  uint *puVar3;
  char *pcVar4;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  timeval tVar5;
  char timebuf [20];
  time_t sec;
  va_list ap;
  undefined1 local_8d8 [8];
  undefined8 local_8d0;
  undefined8 local_8c8;
  undefined8 local_8c0;
  undefined8 local_8b8;
  undefined8 local_8b0;
  undefined8 local_8a8;
  undefined8 local_898;
  undefined8 local_888;
  undefined8 local_878;
  undefined8 local_868;
  undefined8 local_858;
  undefined8 local_848;
  undefined8 local_838;
  char buffer [2049];
  
  if (in_AL != '\0') {
    local_8a8 = in_XMM0_Qa;
    local_898 = in_XMM1_Qa;
    local_888 = in_XMM2_Qa;
    local_878 = in_XMM3_Qa;
    local_868 = in_XMM4_Qa;
    local_858 = in_XMM5_Qa;
    local_848 = in_XMM6_Qa;
    local_838 = in_XMM7_Qa;
  }
  local_8d0 = in_RSI;
  local_8c8 = in_RDX;
  local_8c0 = in_RCX;
  local_8b8 = in_R8;
  local_8b0 = in_R9;
  if (serverlogfile == (char *)0x0) {
    curl_mfprintf(_stderr,"Error: serverlogfile not set\n");
    return;
  }
  tVar5 = tvnow();
  if (logmsg_known_offset != '\x01') {
    tVar1 = time((time_t *)0x0);
    logmsg::epoch_offset = tVar1 - tVar5.tv_sec;
    logmsg_known_offset = '\x01';
  }
  sec = logmsg::epoch_offset + tVar5.tv_sec;
  ptVar2 = localtime(&sec);
  curl_msnprintf(timebuf,0x14,"%02d:%02d:%02d.%06ld",(ulong)(uint)ptVar2->tm_hour,
                 (ulong)(uint)ptVar2->tm_min,(ulong)(uint)ptVar2->tm_sec,tVar5.tv_usec);
  ap[0].gp_offset = 8;
  ap[0].fp_offset = 0x30;
  ap[0].overflow_arg_area = &stack0x00000008;
  ap[0].reg_save_area = local_8d8;
  curl_mvsnprintf(buffer,0x801,msg,ap);
  __stream = fopen64(serverlogfile,"ab");
  if (__stream == (FILE *)0x0) {
    puVar3 = (uint *)__errno_location();
    whereto = _stderr;
    __errnum = *puVar3;
    pcVar4 = strerror(__errnum);
    curl_mfprintf(whereto,"fopen() failed with error: %d %s\n",(ulong)__errnum,pcVar4);
    curl_mfprintf(_stderr,"Error opening file: %s\n",serverlogfile);
    curl_mfprintf(_stderr,"Msg not logged: %s %s\n",timebuf,buffer);
  }
  else {
    curl_mfprintf((FILE *)__stream,"%s %s\n",timebuf,buffer);
    fclose(__stream);
  }
  return;
}

Assistant:

void logmsg(const char *msg, ...)
{
  va_list ap;
  char buffer[2048 + 1];
  FILE *logfp;
  int error;
  struct timeval tv;
  time_t sec;
  struct tm *now;
  char timebuf[20];
  static time_t epoch_offset;
  static int    known_offset;

  if(!serverlogfile) {
    fprintf(stderr, "Error: serverlogfile not set\n");
    return;
  }

  tv = tvnow();
  if(!known_offset) {
    epoch_offset = time(NULL) - tv.tv_sec;
    known_offset = 1;
  }
  sec = epoch_offset + tv.tv_sec;
  now = localtime(&sec); /* not thread safe but we don't care */

  snprintf(timebuf, sizeof(timebuf), "%02d:%02d:%02d.%06ld",
    (int)now->tm_hour, (int)now->tm_min, (int)now->tm_sec, (long)tv.tv_usec);

  va_start(ap, msg);
  vsnprintf(buffer, sizeof(buffer), msg, ap);
  va_end(ap);

  logfp = fopen(serverlogfile, "ab");
  if(logfp) {
    fprintf(logfp, "%s %s\n", timebuf, buffer);
    fclose(logfp);
  }
  else {
    error = errno;
    fprintf(stderr, "fopen() failed with error: %d %s\n",
            error, strerror(error));
    fprintf(stderr, "Error opening file: %s\n", serverlogfile);
    fprintf(stderr, "Msg not logged: %s %s\n", timebuf, buffer);
  }
}